

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

uint Dau_DecReadSet(char *pStr)

{
  char cVar1;
  uint uVar2;
  byte bVar3;
  undefined8 in_RCX;
  undefined8 uVar4;
  uint uVar6;
  char *pcVar7;
  ulong uVar5;
  
  uVar4 = CONCAT71((int7)((ulong)in_RCX >> 8),*pStr);
  if (*pStr == '\0') {
    return 0;
  }
  pcVar7 = pStr + 1;
  uVar2 = 0;
  do {
    uVar6 = (int)uVar4 - 0x61;
    if ((byte)uVar6 < 0x1a) {
      uVar6 = (uVar6 & 0xff) * 2;
      uVar5 = (ulong)uVar6;
      uVar6 = 1 << ((byte)uVar6 & 0x1f);
    }
    else {
      bVar3 = (char)uVar4 + 0xbf;
      uVar5 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar3);
      if (0x19 < bVar3) {
        return uVar2;
      }
    }
    uVar2 = uVar2 | uVar6;
    cVar1 = *pcVar7;
    uVar4 = CONCAT71((int7)(uVar5 >> 8),cVar1);
    pcVar7 = pcVar7 + 1;
  } while (cVar1 != '\0');
  return uVar2;
}

Assistant:

unsigned Dau_DecReadSet( char * pStr )
{
    unsigned uSet = 0; int v;
    for ( v = 0; pStr[v]; v++ )
    {
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1));
        else if ( pStr[v] >= 'A' && pStr[v] <= 'Z' )
            uSet |= (1 << ((pStr[v] - 'a') << 1)) | (1 << (((pStr[v] - 'a') << 1)+1));
        else break;
    }
    return uSet;
}